

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_SetBlendFunction
               (GPU_Image *image,GPU_BlendFuncEnum source_color,GPU_BlendFuncEnum dest_color,
               GPU_BlendFuncEnum source_alpha,GPU_BlendFuncEnum dest_alpha)

{
  if (image != (GPU_Image *)0x0) {
    (image->blend_mode).source_color = source_color;
    (image->blend_mode).dest_color = dest_color;
    (image->blend_mode).source_alpha = source_alpha;
    (image->blend_mode).dest_alpha = dest_alpha;
  }
  return;
}

Assistant:

void GPU_SetBlendFunction(GPU_Image* image, GPU_BlendFuncEnum source_color, GPU_BlendFuncEnum dest_color, GPU_BlendFuncEnum source_alpha, GPU_BlendFuncEnum dest_alpha)
{
    if(image == NULL)
        return;

    image->blend_mode.source_color = source_color;
    image->blend_mode.dest_color = dest_color;
    image->blend_mode.source_alpha = source_alpha;
    image->blend_mode.dest_alpha = dest_alpha;
}